

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void swap_data(bam1_core_t *c,int l_data,uint8_t *data,int is_host)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint32_t *x;
  uint *x_00;
  uint local_40;
  int size;
  uint32_t n;
  uint32_t i;
  uint32_t *cigar;
  uint8_t *s;
  int is_host_local;
  uint8_t *data_local;
  int l_data_local;
  bam1_core_t *c_local;
  
  uVar2 = *(undefined8 *)&c->field_0x8;
  uVar3 = *(undefined8 *)&c->field_0x8;
  uVar4 = *(undefined8 *)&c->field_0x8;
  iVar5 = c->l_qseq;
  iVar1 = c->l_qseq;
  for (size = 0;
      cigar = (uint32_t *)
              (data + (long)((iVar1 + 1) / 2) +
                      (long)iVar5 +
                      (long)(int)((uint)((ulong)uVar4 >> 0x18) & 0xff) +
                      (long)(int)((uint)(ushort)((ulong)uVar3 >> 0x30) << 2)),
      (uint)size < (uint)(ushort)((ulong)*(undefined8 *)&c->field_0x8 >> 0x30); size = size + 1) {
    ed_swap_4p(data + (ulong)(uint)size * 4 + (long)(int)((uint)((ulong)uVar2 >> 0x18) & 0xff));
  }
  while (cigar < data + l_data) {
    iVar5 = aux_type2size(*(uint8_t *)((long)cigar + 2));
    x = (uint32_t *)((long)cigar + 3);
    if (iVar5 == 1) {
      cigar = cigar + 1;
    }
    else if (iVar5 == 2) {
      ed_swap_2p(x);
      cigar = (uint32_t *)((long)cigar + 5);
    }
    else if (iVar5 == 4) {
      ed_swap_4p(x);
      cigar = (uint32_t *)((long)cigar + 7);
    }
    else if (iVar5 == 8) {
      ed_swap_8p(x);
      cigar = (uint32_t *)((long)cigar + 0xb);
    }
    else if (iVar5 == 0x42) {
      iVar5 = aux_type2size(*(uint8_t *)x);
      x_00 = cigar + 1;
      if (is_host == 0) {
        ed_swap_4p(x_00);
        local_40 = *x_00;
      }
      else {
        local_40 = *x_00;
        ed_swap_4p(x_00);
      }
      cigar = cigar + 2;
      switch(iVar5) {
      case 1:
        cigar = (uint32_t *)((long)cigar + (ulong)local_40);
        break;
      case 2:
        for (size = 0; (uint)size < local_40; size = size + 1) {
          ed_swap_2p(cigar);
          cigar = (uint32_t *)((long)cigar + 2);
        }
        break;
      case 4:
        for (size = 0; (uint)size < local_40; size = size + 1) {
          ed_swap_4p(cigar);
          cigar = cigar + 1;
        }
        break;
      case 8:
        for (size = 0; (uint)size < local_40; size = size + 1) {
          ed_swap_8p(cigar);
          cigar = cigar + 2;
        }
      }
    }
    else {
      cigar = x;
      if ((iVar5 == 0x48) || (iVar5 == 0x5a)) {
        for (; (char)*cigar != '\0'; cigar = (uint32_t *)((long)cigar + 1)) {
        }
        cigar = (uint32_t *)((long)cigar + 1);
      }
    }
  }
  return;
}

Assistant:

static void swap_data(const bam1_core_t *c, int l_data, uint8_t *data, int is_host)
{
    uint8_t *s;
    uint32_t *cigar = (uint32_t*)(data + c->l_qname);
    uint32_t i, n;
    s = data + c->n_cigar*4 + c->l_qname + c->l_qseq + (c->l_qseq + 1)/2;
    for (i = 0; i < c->n_cigar; ++i) ed_swap_4p(&cigar[i]);
    while (s < data + l_data) {
        int size;
        s += 2; // skip key
        size = aux_type2size(*s); ++s; // skip type
        switch (size) {
        case 1: ++s; break;
        case 2: ed_swap_2p(s); s += 2; break;
        case 4: ed_swap_4p(s); s += 4; break;
        case 8: ed_swap_8p(s); s += 8; break;
        case 'Z':
        case 'H':
            while (*s) ++s;
            ++s;
            break;
        case 'B':
            size = aux_type2size(*s); ++s;
            if (is_host) memcpy(&n, s, 4), ed_swap_4p(s);
            else ed_swap_4p(s), memcpy(&n, s, 4);
            s += 4;
            switch (size) {
            case 1: s += n; break;
            case 2: for (i = 0; i < n; ++i, s += 2) ed_swap_2p(s); break;
            case 4: for (i = 0; i < n; ++i, s += 4) ed_swap_4p(s); break;
            case 8: for (i = 0; i < n; ++i, s += 8) ed_swap_8p(s); break;
            }
            break;
        }
    }
}